

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

void duckdb::NextDay(int32_t *year,int32_t *month,int32_t *day)

{
  int iVar1;
  char cVar2;
  
  iVar1 = *day;
  *day = iVar1 + 1;
  cVar2 = duckdb::Date::IsValid(*year,*month,iVar1 + 1);
  if (cVar2 == '\0') {
    iVar1 = *month;
    *month = iVar1 + 1;
    if (iVar1 + 1 == 0xd) {
      *year = *year + 1;
      *month = 1;
    }
    *day = 1;
  }
  return;
}

Assistant:

void NextDay(int32_t &year, int32_t &month, int32_t &day) {
	day++;
	if (!Date::IsValid(year, month, day)) {
		// day is out of range for month, move to next month
		NextMonth(year, month);
		day = 1;
	}
}